

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderprogram.cpp
# Opt level: O3

void __thiscall
graphics101::ShaderProgram::setUniform
          (ShaderProgram *this,string *name,
          vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
          *value)

{
  pointer pvVar1;
  uint uVar2;
  pointer pvVar3;
  ulong uVar4;
  
  if (this->m_program != 0) {
    (*gl3wProcs.ptr[0x22f])();
    uVar2 = anon_unknown.dwarf_11fe9e::location(this->m_program,name);
    pvVar1 = (value->
             super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(value->
                  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
    pvVar3 = (pointer)0x0;
    if (uVar4 != 0) {
      pvVar3 = pvVar1;
    }
    (*gl3wProcs.ptr[0x204])((ulong)uVar2,uVar4 >> 3,pvVar3,pvVar1,gl3wProcs.ptr[0x204]);
    return;
  }
  __assert_fail("m_program != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/shaderprogram.cpp"
                ,0xdc,"void graphics101::ShaderProgram::use() const");
}

Assistant:

void ShaderProgram::setUniform( const std::string& name, const std::vector< vec2 >& value ) {
    use();
    bind_uniform( location( m_program, name ), value );
}